

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O1

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand,CoreType type)

{
  _Manager_type *pp_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  __it;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar5;
  undefined8 local_48;
  function<bool_(const_std::shared_ptr<helics::Broker>_&)> *local_40;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)operand);
  if (iVar4 == 0) {
    __it._M_node = *(_Base_ptr *)&operand[2].super__Function_base._M_functor;
    pp_Var1 = &operand[1].super__Function_base._M_manager;
    local_40 = operand;
    local_48 = CONCAT44(in_register_00000014,type);
    while ((__it._M_node != (_Base_ptr)pp_Var1 &&
           (bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<gmlc::concurrency::SearchableObjectHolder<helics::Broker,helics::CoreType>::findObject(std::function<bool(std::shared_ptr<helics::Broker>const&)>,helics::CoreType)::{lambda(auto:1&)#1}>
                    ::operator()((_Iter_pred<gmlc::concurrency::SearchableObjectHolder<helics::Broker,helics::CoreType>::findObject(std::function<bool(std::shared_ptr<helics::Broker>const&)>,helics::CoreType)::_lambda(auto:1&)_1_>
                                  *)&local_48,__it), !bVar3))) {
      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
    }
    if (__it._M_node == (_Base_ptr)pp_Var1) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(__it._M_node + 2);
      p_Var2 = __it._M_node[2]._M_parent;
      *(_Base_ptr *)(this + 8) = p_Var2;
      if (p_Var2 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)operand);
    sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<helics::Broker>)
           sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::shared_ptr<X>
        findObject(std::function<bool(const std::shared_ptr<X>&)> operand,
                   Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto obj = std::find_if(objectMap.begin(),
                                objectMap.end(),
                                [&operand, this, type](auto& val) {
                                    if (operand(val.second)) {
                                        auto tfind = typeMap.find(val.first);
                                        if (tfind != typeMap.end()) {
                                            for (auto& t : tfind->second) {
                                                if (t == type) {
                                                    return true;
                                                }
                                            }
                                        }
                                    }
                                    return false;
                                });
        if (obj != objectMap.end()) {
            return obj->second;
        }
        return nullptr;
    }